

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalFileInputSource.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::LocalFileInputSource::LocalFileInputSource
          (LocalFileInputSource *this,XMLCh *filePath,MemoryManager *manager)

{
  bool bVar1;
  int iVar2;
  XMLCh *pXVar3;
  XMLSize_t XVar4;
  XMLSize_t XVar5;
  undefined4 extraout_var;
  XMLCh *target;
  
  InputSource::InputSource(&this->super_InputSource,manager);
  (this->super_InputSource)._vptr_InputSource = (_func_int **)&PTR__LocalFileInputSource_003ffc48;
  bVar1 = XMLPlatformUtils::isRelative(filePath,manager);
  if (bVar1) {
    pXVar3 = XMLPlatformUtils::getCurrentDirectory(manager);
    XVar4 = XMLString::stringLen(pXVar3);
    XVar5 = XMLString::stringLen(filePath);
    iVar2 = (*manager->_vptr_MemoryManager[3])(manager,(XVar5 + XVar4) * 2 + 4);
    target = (XMLCh *)CONCAT44(extraout_var,iVar2);
    XMLString::copyString(target,pXVar3);
    target[XVar4] = L'/';
    XMLString::copyString(target + XVar4 + 1,filePath);
    XMLPlatformUtils::removeDotSlash(target,manager);
    XMLPlatformUtils::removeDotDotSlash(target,manager);
    (*(this->super_InputSource)._vptr_InputSource[9])(this,target);
    (*manager->_vptr_MemoryManager[4])(manager,pXVar3);
    (*manager->_vptr_MemoryManager[4])(manager,target);
  }
  else {
    pXVar3 = XMLString::replicate(filePath,manager);
    XMLPlatformUtils::removeDotSlash(pXVar3,manager);
    (*(this->super_InputSource)._vptr_InputSource[9])(this,pXVar3);
    (*manager->_vptr_MemoryManager[4])(manager,pXVar3);
  }
  return;
}

Assistant:

LocalFileInputSource::LocalFileInputSource(const XMLCh* const filePath,
                                           MemoryManager* const manager)
    : InputSource(manager)
{

    //
    //  If the path is relative, then complete it acording to the current
    //  working directory rules of the current platform. Else, just take
    //  it as is.
    //
    if (XMLPlatformUtils::isRelative(filePath, manager))
    {
        XMLCh* curDir = XMLPlatformUtils::getCurrentDirectory(manager);

        XMLSize_t curDirLen = XMLString::stringLen(curDir);
        XMLSize_t filePathLen = XMLString::stringLen(filePath);
        XMLCh* fullDir = (XMLCh*) manager->allocate
        (
            (curDirLen + filePathLen + 2) * sizeof(XMLCh)
        );//new XMLCh [ curDirLen + filePathLen + 2];

        XMLString::copyString(fullDir, curDir);
        fullDir[curDirLen] = chForwardSlash;
        XMLString::copyString(&fullDir[curDirLen+1], filePath);
        
        XMLPlatformUtils::removeDotSlash(fullDir, manager);
        XMLPlatformUtils::removeDotDotSlash(fullDir, manager);

        setSystemId(fullDir);

        manager->deallocate(curDir);//delete [] curDir;
        manager->deallocate(fullDir);//delete [] fullDir;
    }
     else
    {
        XMLCh* tmpBuf = XMLString::replicate(filePath, manager);
        XMLPlatformUtils::removeDotSlash(tmpBuf, manager);
        setSystemId(tmpBuf);
        manager->deallocate(tmpBuf);//delete [] tmpBuf;
    }

}